

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_util.cc
# Opt level: O3

int raptor_sockaddr_to_v4mapped
              (raptor_resolved_address *resolved_addr,raptor_resolved_address *resolved_addr6_out)

{
  int iVar1;
  raptor_resolved_address *prVar2;
  long lVar3;
  raptor_sockaddr_in *addr4;
  bool bVar4;
  raptor_resolved_address rStack_b4;
  
  if (resolved_addr != resolved_addr6_out) {
    bVar4 = *(short *)resolved_addr->addr == 2;
    if (bVar4) {
      memset(resolved_addr6_out,0,0x84);
      resolved_addr6_out->addr[0] = '\n';
      resolved_addr6_out->addr[1] = '\0';
      resolved_addr6_out->addr[8] = '\0';
      resolved_addr6_out->addr[9] = '\0';
      resolved_addr6_out->addr[10] = '\0';
      resolved_addr6_out->addr[0xb] = '\0';
      resolved_addr6_out->addr[0xc] = '\0';
      resolved_addr6_out->addr[0xd] = '\0';
      resolved_addr6_out->addr[0xe] = '\0';
      resolved_addr6_out->addr[0xf] = '\0';
      resolved_addr6_out->addr[0x10] = '\0';
      resolved_addr6_out->addr[0x11] = '\0';
      resolved_addr6_out->addr[0x12] = -1;
      resolved_addr6_out->addr[0x13] = -1;
      *(undefined4 *)(resolved_addr6_out->addr + 0x14) = *(undefined4 *)(resolved_addr->addr + 4);
      *(undefined2 *)(resolved_addr6_out->addr + 2) = *(undefined2 *)(resolved_addr->addr + 2);
      resolved_addr6_out->len = 0x1c;
    }
    return (uint)bVar4;
  }
  raptor_sockaddr_to_v4mapped();
  iVar1 = raptor_sockaddr_is_v4mapped(resolved_addr,&rStack_b4);
  prVar2 = &rStack_b4;
  if (iVar1 == 0) {
    prVar2 = resolved_addr;
  }
  if (*(short *)prVar2->addr == 2) {
    prVar2 = &rStack_b4;
    if (iVar1 == 0) {
      prVar2 = resolved_addr;
    }
    if (*(int *)(prVar2->addr + 4) != 0) {
      return 0;
    }
  }
  else {
    if (*(short *)prVar2->addr != 10) {
      return 0;
    }
    prVar2 = &rStack_b4;
    if (iVar1 == 0) {
      prVar2 = resolved_addr;
    }
    lVar3 = 0;
    do {
      if (prVar2->addr[lVar3 + 8] != '\0') {
        return 0;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x10);
  }
  prVar2 = &rStack_b4;
  if (iVar1 == 0) {
    prVar2 = resolved_addr;
  }
  *(uint *)resolved_addr6_out->addr =
       (uint)(ushort)(*(ushort *)(prVar2->addr + 2) << 8 | *(ushort *)(prVar2->addr + 2) >> 8);
  return 1;
}

Assistant:

int raptor_sockaddr_to_v4mapped(const raptor_resolved_address* resolved_addr,
                                raptor_resolved_address* resolved_addr6_out) {
    RAPTOR_ASSERT(resolved_addr != resolved_addr6_out);
    const raptor_sockaddr* addr =
        reinterpret_cast<const raptor_sockaddr*>(resolved_addr->addr);
    raptor_sockaddr_in6* addr6_out =
        reinterpret_cast<raptor_sockaddr_in6*>(resolved_addr6_out->addr);
    if (addr->sa_family == AF_INET) {
        const raptor_sockaddr_in* addr4 =
            reinterpret_cast<const raptor_sockaddr_in*>(addr);
        memset(resolved_addr6_out, 0, sizeof(*resolved_addr6_out));
        addr6_out->sin6_family = AF_INET6;
        memcpy(&addr6_out->sin6_addr.s6_addr[0], kV4MappedPrefix, 12);
        memcpy(&addr6_out->sin6_addr.s6_addr[12], &addr4->sin_addr, 4);
        addr6_out->sin6_port = addr4->sin_port;
        resolved_addr6_out->len = static_cast<socklen_t>(sizeof(raptor_sockaddr_in6));
        return 1;
    }
    return 0;
}